

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

void __thiscall Console::Prompt::Private::promptWrite(Private *this,usize offset,String *clearStr)

{
  usize *puVar1;
  long lVar2;
  char cVar3;
  code *pcVar4;
  Iterator IVar5;
  String *pSVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  byte *data;
  long lVar11;
  byte bVar12;
  ulong size;
  uint32 *puVar13;
  ulong uVar14;
  Array<unsigned_int> wrappedBuffer;
  Array<unsigned_int> buffer;
  String dataToWrite;
  Array<unsigned_int> local_c8;
  String *local_b0;
  Array<unsigned_int> local_a8;
  String local_88;
  ulong local_60;
  String local_58;
  
  uVar9 = offset / this->stdoutScreenWidth;
  local_a8._capacity =
       ((long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2) +
       clearStr->data->len + ((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2);
  local_a8._begin.item = (uint *)0x0;
  local_a8._end.item = (uint *)0x0;
  Array<unsigned_int>::append(&local_a8,&this->prompt);
  Array<unsigned_int>::append(&local_a8,&this->input);
  if (1 < clearStr->data->len) {
    iVar8 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                          ,0x19c,"clearStr.isEmpty() || clearStr.length() == 1");
    if (iVar8 != 0) goto LAB_00106813;
  }
  local_b0 = (String *)offset;
  local_60 = uVar9;
  if (clearStr->data->len != 0) {
    pcVar10 = String::operator_cast_to_char_(clearStr);
    cVar3 = *pcVar10;
    Array<unsigned_int>::reserve
              (&local_a8,((long)local_a8._end.item - (long)local_a8._begin.item >> 2) + 1);
    *local_a8._end.item = (int)cVar3;
    local_a8._end.item = local_a8._end.item + 1;
  }
  uVar9 = (long)local_a8._end.item - (long)local_a8._begin.item >> 2;
  local_c8._capacity = uVar9 + (uVar9 / this->stdoutScreenWidth) * 2 + 2;
  local_c8._begin.item = (uint *)0x0;
  local_c8._end.item = (uint32 *)0x0;
  if (local_a8._end.item != local_a8._begin.item) {
    uVar14 = 0;
    do {
      size = uVar9 - uVar14;
      if (this->stdoutScreenWidth <= uVar9 - uVar14) {
        size = this->stdoutScreenWidth;
      }
      Array<unsigned_int>::append(&local_c8,local_a8._begin.item + uVar14,size);
      if (size == this->stdoutScreenWidth) {
        Array<unsigned_int>::reserve
                  (&local_c8,((long)local_c8._end.item - (long)local_c8._begin.item >> 2) + 1);
        *local_c8._end.item = 0xd;
        local_c8._end.item = local_c8._end.item + 1;
        Array<unsigned_int>::reserve
                  (&local_c8,((long)local_c8._end.item - (long)local_c8._begin.item >> 2) + 1);
        *local_c8._end.item = 10;
        local_c8._end.item = local_c8._end.item + 1;
      }
      uVar14 = uVar14 + this->stdoutScreenWidth;
    } while (uVar14 < uVar9);
  }
  lVar2 = (long)local_b0 + local_60 * 2;
  uVar9 = (long)local_c8._end.item - (long)(local_c8._begin.item + lVar2) & 0xfffffffffffffffc;
  local_58.data = (Data *)operator_new__(uVar9 + 0x2b);
  (local_58.data)->str = (char *)(local_58.data + 1);
  *(undefined1 *)&local_58.data[1].str = 0;
  (local_58.data)->len = 0;
  (local_58.data)->ref = 1;
  (local_58.data)->capacity = uVar9 + 10;
  local_88._data.ref = 0;
  local_88._data.str = "\x1b[?7l";
  local_88._data.len = 5;
  local_88.data = &local_88._data;
  String::append(&local_58,&local_88);
  local_b0 = clearStr;
  if ((local_88.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_88.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_88.data != (Data *)0x0)) {
      operator_delete__(local_88.data);
    }
  }
  IVar5.item = local_c8._end.item;
  lVar11 = (long)local_c8._end.item - (long)local_c8._begin.item >> 2;
  if (lVar11 != lVar2 && -1 < lVar11 - lVar2) {
    puVar13 = local_c8._begin.item + lVar2;
    bVar12 = 1;
    do {
      bVar7 = Unicode::append(*puVar13,&local_58);
      bVar12 = bVar12 & bVar7;
      puVar13 = puVar13 + 1;
    } while (puVar13 < IVar5.item);
    if (bVar12 == 0) {
      iVar8 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                            ,0x1b1,
                            "Unicode::append((const conchar*)wrappedBuffer + offset, wrappedBuffer.size() - offset, dataToWrite)"
                           );
      if (iVar8 != 0) {
LAB_00106813:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
    }
  }
  local_88._data.ref = 0;
  local_88._data.str = "\x1b[?7h";
  local_88._data.len = 5;
  local_88.data = &local_88._data;
  String::append(&local_58,&local_88);
  pSVar6 = local_b0;
  if ((local_88.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_88.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_88.data != (Data *)0x0)) {
      operator_delete__(local_88.data);
    }
  }
  data = (byte *)String::operator_cast_to_char_(&local_58);
  Buffer::append(&this->bufferedOutput,data,(local_58.data)->len);
  uVar9 = ((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2) + pSVar6->data->len
  ;
  if (this->caretPos < uVar9) {
    moveCursorPosition(this,uVar9 + ((long)(this->prompt)._end.item -
                                     (long)(this->prompt)._begin.item >> 2),this->caretPos - uVar9);
  }
  if ((local_58.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_58.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
      operator_delete__(local_58.data);
    }
  }
  if (local_c8._begin.item != (uint *)0x0) {
    operator_delete__(local_c8._begin.item);
  }
  if (local_a8._begin.item != (uint *)0x0) {
    operator_delete__(local_a8._begin.item);
  }
  return;
}

Assistant:

void promptWrite(usize offset = 0, const String& clearStr = String())
  {
    offset += offset / stdoutScreenWidth * 2;
    Array<conchar> buffer(prompt.size() + input.size() + clearStr.length());
    buffer.append(prompt);
    buffer.append(input);
    ASSERT(clearStr.isEmpty() || clearStr.length() == 1);
    if(!clearStr.isEmpty())
      buffer.append(*(const char*)clearStr);
    Array<conchar> wrappedBuffer(buffer.size() + buffer.size() / stdoutScreenWidth * 2 + 2);
    for(usize i = 0, len = buffer.size(); i < len; i += stdoutScreenWidth)
    {
      usize lineEnd = len - i;
      if(lineEnd > stdoutScreenWidth)
        lineEnd = stdoutScreenWidth;
      wrappedBuffer.append((const conchar*)buffer + i, lineEnd);
      if(lineEnd == stdoutScreenWidth)
      {
        wrappedBuffer.append('\r');
        wrappedBuffer.append('\n');
      }
    }
#ifdef _MSC_VER
    writeConsole((const conchar*)wrappedBuffer + offset, wrappedBuffer.size() - offset);
#else
    String dataToWrite((wrappedBuffer.size() - offset) * sizeof(uint32) + 10);
    dataToWrite.append("\x1b[?7l");
    VERIFY(Unicode::append((const conchar*)wrappedBuffer + offset, wrappedBuffer.size() - offset, dataToWrite));
    dataToWrite.append("\x1b[?7h");
    writeConsole(dataToWrite, dataToWrite.length());
#endif
    if(caretPos < input.size() + clearStr.length())
      moveCursorPosition(prompt.size() + input.size() + clearStr.length(), -(ssize)(input.size() + clearStr.length() - caretPos));
#ifdef _MSC_VER
    else // enforce cursor blink timer reset
      moveCursorPosition(prompt.size() + input.size() + clearStr.length(), 0);
#endif
  }